

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_ALIGNPTS(TT_ExecContext exc,FT_Long *args)

{
  ushort uVar1;
  ushort uVar2;
  FT_F26Dot6 FVar3;
  FT_F26Dot6 distance;
  FT_UShort p2;
  FT_UShort p1;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = (ushort)*args;
  uVar2 = (ushort)args[1];
  if ((uVar1 < (exc->zp1).n_points) && (uVar2 < (exc->zp0).n_points)) {
    FVar3 = (*exc->func_project)
                      (exc,(exc->zp0).cur[(int)(uint)uVar2].x - (exc->zp1).cur[(int)(uint)uVar1].x,
                       (exc->zp0).cur[(int)(uint)uVar2].y - (exc->zp1).cur[(int)(uint)uVar1].y);
    (*exc->func_move)(exc,&exc->zp1,uVar1,FVar3 / 2);
    (*exc->func_move)(exc,&exc->zp0,uVar2,-(FVar3 / 2));
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  return;
}

Assistant:

static void
  Ins_ALIGNPTS( TT_ExecContext  exc,
                FT_Long*        args )
  {
    FT_UShort   p1, p2;
    FT_F26Dot6  distance;


    p1 = (FT_UShort)args[0];
    p2 = (FT_UShort)args[1];

    if ( BOUNDS( p1, exc->zp1.n_points ) ||
         BOUNDS( p2, exc->zp0.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      return;
    }

    distance = PROJECT( exc->zp0.cur + p2, exc->zp1.cur + p1 ) / 2;

    exc->func_move( exc, &exc->zp1, p1, distance );
    exc->func_move( exc, &exc->zp0, p2, NEG_LONG( distance ) );
  }